

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowDebugLogWindow(bool *p_open)

{
  ImGuiDebugLogFlags *flags;
  ImRect *r_min;
  char *text_end;
  uint uVar1;
  ImGuiWindow *pIVar2;
  _func_void_void_ptr_char_ptr *p_Var3;
  int *piVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImGuiID id_00;
  char *pcVar10;
  ImGuiContext *g_1;
  char *text_end_00;
  int iVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  ImGuiContext *g;
  ImGuiContext *pIVar15;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImGuiID id;
  ImGuiListClipper clipper;
  ImGuiID local_9c;
  ImGuiListClipper local_98;
  ImGuiContext *local_78;
  ImVec2 *local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  pIVar15 = GImGui;
  uVar1 = (GImGui->NextWindowData).Flags;
  if ((uVar1 & 2) == 0) {
    fVar16 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar1 | 2;
    (pIVar15->NextWindowData).SizeVal.x = 0.0;
    (pIVar15->NextWindowData).SizeVal.y = fVar16 * 12.0;
    (pIVar15->NextWindowData).SizeCond = 4;
  }
  bVar9 = Begin("Dear ImGui Debug Log",p_open,0);
  pIVar8 = GImGui;
  if ((bVar9) &&
     (GImGui->CurrentWindow->WriteAccessed = true, pIVar8->CurrentWindow->BeginCount < 2)) {
    AlignTextToFramePadding();
    Text("Log events:");
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    flags = &pIVar15->DebugLogFlags;
    CheckboxFlags("All",flags,0x3f);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    CheckboxFlags("ActiveId",flags,1);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    CheckboxFlags("Focus",flags,2);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    CheckboxFlags("Popup",flags,4);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    CheckboxFlags("Nav",flags,8);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    CheckboxFlags("Clipper",flags,0x10);
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    CheckboxFlags("IO",flags,0x20);
    bVar9 = SmallButton("Clear");
    if (bVar9) {
      ImGuiTextBuffer::clear(&pIVar15->DebugLogBuf);
      ImGuiTextIndex::clear(&pIVar15->DebugLogIndex);
    }
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == false) {
      (pIVar2->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
    }
    bVar9 = SmallButton("Copy");
    if ((bVar9) &&
       (p_Var3 = (GImGui->IO).SetClipboardTextFn, p_Var3 != (_func_void_void_ptr_char_ptr *)0x0)) {
      pcVar10 = (pIVar15->DebugLogBuf).Buf.Data;
      pcVar12 = ImGuiTextBuffer::EmptyString;
      if (pcVar10 != (char *)0x0) {
        pcVar12 = pcVar10;
      }
      (*p_Var3)((GImGui->IO).ClipboardUserData,pcVar12);
    }
    pIVar8 = GImGui;
    local_98.DisplayStart = 0;
    local_98.DisplayEnd = 0;
    GImGui->CurrentWindow->WriteAccessed = true;
    id_00 = ImGuiWindow::GetID(pIVar8->CurrentWindow,"##log",(char *)0x0);
    BeginChildEx("##log",id_00,(ImVec2 *)&local_98,true,0xc000);
    local_98.DisplayStart = 0;
    local_98.DisplayEnd = 0;
    local_98.StartPosY = 0.0;
    local_98._20_4_ = 0;
    local_98.TempData = (void *)0x0;
    local_98.ItemsCount = -1;
    local_98.ItemsHeight = 0.0;
    ImGuiListClipper::Begin(&local_98,(pIVar15->DebugLogIndex).LineOffsets.Size,-1.0);
    r_min = &(pIVar15->LastItemData).Rect;
    local_70 = &(pIVar15->LastItemData).Rect.Max;
    local_78 = pIVar15;
    while (bVar9 = ImGuiListClipper::Step(&local_98), bVar9) {
      lVar13 = (long)local_98.DisplayStart;
      if (local_98.DisplayStart < local_98.DisplayEnd) {
        do {
          pcVar10 = (pIVar15->DebugLogBuf).Buf.Data;
          if (pcVar10 == (char *)0x0) {
            pcVar10 = ImGuiTextBuffer::EmptyString;
          }
          piVar4 = (pIVar15->DebugLogIndex).LineOffsets.Data;
          lVar14 = lVar13 + 1;
          if (lVar14 < (pIVar15->DebugLogIndex).LineOffsets.Size) {
            iVar11 = piVar4[lVar14] + -1;
          }
          else {
            iVar11 = (pIVar15->DebugLogIndex).EndOffset;
          }
          pcVar12 = pcVar10 + piVar4[lVar13];
          pcVar10 = pcVar10 + iVar11;
          TextUnformatted(pcVar12,pcVar10);
          local_68 = r_min->Min;
          uStack_60 = 0;
          bVar9 = IsItemHovered(0);
          if ((bVar9) && (pcVar12 < pcVar10 + -10)) {
            local_48 = local_68.y + 0.0;
            fStack_44 = local_68.y;
            fStack_40 = local_68.y;
            fStack_3c = local_68.y;
            text_end_00 = pcVar12;
            do {
              local_9c = 0;
              if (((*text_end_00 == '0') && ((byte)(text_end_00[1] | 0x20U) == 0x78)) &&
                 (iVar11 = __isoc99_sscanf(text_end_00 + 2,"%X",&local_9c), iVar11 == 1)) {
                fVar16 = GImGui->FontSize;
                if (text_end_00 == pcVar12) {
                  _local_58 = ZEXT416((uint)fVar16) << 0x20;
                }
                else {
                  IVar5 = ImFont::CalcTextSizeA
                                    (GImGui->Font,fVar16,3.4028235e+38,-1.0,pcVar12,text_end_00,
                                     (char **)0x0);
                  local_58._4_4_ = IVar5.y;
                  local_58._0_4_ = (float)(int)(IVar5.x + 0.99999);
                  uStack_50 = extraout_XMM0_Dc;
                  uStack_4c = extraout_XMM0_Dd;
                  fVar16 = GImGui->FontSize;
                }
                text_end = text_end_00 + 10;
                IVar6 = ImFont::CalcTextSizeA
                                  (GImGui->Font,fVar16,3.4028235e+38,-1.0,text_end_00,text_end,
                                   (char **)0x0);
                IVar7.y = local_48;
                IVar7.x = local_68.x + (float)local_58._0_4_;
                r_min->Min = IVar7;
                IVar5.y = IVar6.y + local_68.y;
                IVar5.x = (float)(int)(IVar6.x + 0.99999) + (float)local_58._0_4_ + local_68.x;
                *local_70 = IVar5;
                bVar9 = IsMouseHoveringRect(&r_min->Min,local_70,true);
                text_end_00 = text_end;
                if (bVar9) {
                  DebugLocateItemOnHover(local_9c);
                }
              }
              text_end_00 = text_end_00 + 1;
            } while (text_end_00 < pcVar10 + -10);
          }
          lVar13 = lVar14;
          pIVar15 = local_78;
        } while (lVar14 < local_98.DisplayEnd);
      }
    }
    if ((GImGui->CurrentWindow->ScrollMax).y <= (GImGui->CurrentWindow->Scroll).y) {
      SetScrollHereY(1.0);
    }
    EndChild();
    End();
    ImGuiListClipper::End(&local_98);
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDebugLogWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 12.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Debug Log", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    AlignTextToFramePadding();
    Text("Log events:");
    SameLine(); CheckboxFlags("All", &g.DebugLogFlags, ImGuiDebugLogFlags_EventMask_);
    SameLine(); CheckboxFlags("ActiveId", &g.DebugLogFlags, ImGuiDebugLogFlags_EventActiveId);
    SameLine(); CheckboxFlags("Focus", &g.DebugLogFlags, ImGuiDebugLogFlags_EventFocus);
    SameLine(); CheckboxFlags("Popup", &g.DebugLogFlags, ImGuiDebugLogFlags_EventPopup);
    SameLine(); CheckboxFlags("Nav", &g.DebugLogFlags, ImGuiDebugLogFlags_EventNav);
    SameLine(); CheckboxFlags("Clipper", &g.DebugLogFlags, ImGuiDebugLogFlags_EventClipper);
    SameLine(); CheckboxFlags("IO", &g.DebugLogFlags, ImGuiDebugLogFlags_EventIO);

    if (SmallButton("Clear"))
    {
        g.DebugLogBuf.clear();
        g.DebugLogIndex.clear();
    }
    SameLine();
    if (SmallButton("Copy"))
        SetClipboardText(g.DebugLogBuf.c_str());
    BeginChild("##log", ImVec2(0.0f, 0.0f), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar);

    ImGuiListClipper clipper;
    clipper.Begin(g.DebugLogIndex.size());
    while (clipper.Step())
        for (int line_no = clipper.DisplayStart; line_no < clipper.DisplayEnd; line_no++)
        {
            const char* line_begin = g.DebugLogIndex.get_line_begin(g.DebugLogBuf.c_str(), line_no);
            const char* line_end = g.DebugLogIndex.get_line_end(g.DebugLogBuf.c_str(), line_no);
            TextUnformatted(line_begin, line_end);
            ImRect text_rect = g.LastItemData.Rect;
            if (IsItemHovered())
                for (const char* p = line_begin; p < line_end - 10; p++)
                {
                    ImGuiID id = 0;
                    if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1)
                        continue;
                    ImVec2 p0 = CalcTextSize(line_begin, p);
                    ImVec2 p1 = CalcTextSize(p, p + 10);
                    g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
                    if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
                        DebugLocateItemOnHover(id);
                    p += 10;
                }
        }
    if (GetScrollY() >= GetScrollMaxY())
        SetScrollHereY(1.0f);
    EndChild();

    End();
}